

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_zero_initialized_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t type_id)

{
  uint32_t id_00;
  SPIRType *pSVar1;
  SPIRConstant *c;
  bool bVar2;
  uint32_t id;
  SPIRType *type;
  uint32_t type_id_local;
  CompilerGLSL *this_local;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id);
  bVar2 = true;
  if ((pSVar1->storage != Private) && (bVar2 = true, pSVar1->storage != Function)) {
    bVar2 = pSVar1->storage == Generic;
  }
  if (!bVar2) {
    __assert_fail("type.storage == StorageClassPrivate || type.storage == StorageClassFunction || type.storage == StorageClassGeneric"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                  ,0x3e4a,
                  "virtual string spirv_cross::CompilerGLSL::to_zero_initialized_expression(uint32_t)"
                 );
  }
  id_00 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
  ParsedIR::make_constant_null(&(this->super_Compiler).ir,id_00,type_id,false);
  c = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,id_00);
  constant_expression_abi_cxx11_(__return_storage_ptr__,this,c,false,false);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_zero_initialized_expression(uint32_t type_id)
{
#ifndef NDEBUG
	auto &type = get<SPIRType>(type_id);
	assert(type.storage == StorageClassPrivate || type.storage == StorageClassFunction ||
	       type.storage == StorageClassGeneric);
#endif
	uint32_t id = ir.increase_bound_by(1);
	ir.make_constant_null(id, type_id, false);
	return constant_expression(get<SPIRConstant>(id));
}